

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void readStartOfFrame(ifstream *inFile,Header *header)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ostream *poVar12;
  char cVar13;
  uint uVar14;
  char *pcVar15;
  ColorComponent *pCVar16;
  
  std::operator<<((ostream *)&std::cout,"Reading SOF Marker \n");
  if (header->numComponents == '\0') {
    iVar7 = std::istream::get();
    iVar8 = std::istream::get();
    cVar4 = std::istream::get();
    if (cVar4 != '\b') {
      poVar12 = std::operator<<((ostream *)&std::cout,"invalid precision :");
      poVar12 = std::operator<<(poVar12,cVar4);
      std::endl<char,std::char_traits<char>>(poVar12);
      goto LAB_00102ea2;
    }
    iVar9 = std::istream::get();
    iVar10 = std::istream::get();
    header->height = iVar10 + iVar9 * 0x100;
    iVar9 = std::istream::get();
    iVar10 = std::istream::get();
    uVar11 = iVar10 + iVar9 * 0x100;
    header->width = uVar11;
    uVar3 = header->height;
    header->mcuHeight = uVar3 + 7 >> 3;
    header->mcuWidth = uVar11 + 7 >> 3;
    header->mcuHeightReal = uVar3 + 7 >> 3;
    header->mcuWidthReal = uVar11 + 7 >> 3;
    if (uVar11 == 0 || uVar3 == 0) {
      pcVar15 = "zero width or height\n";
    }
    else {
      bVar5 = std::istream::get();
      header->numComponents = bVar5;
      if (bVar5 == 0) {
        pcVar15 = "number of color components must not be zero";
      }
      else if (bVar5 == 4) {
        pcVar15 = "not support CMYK color mode";
      }
      else {
        uVar14 = 0xffffffff;
        do {
          uVar14 = uVar14 + 1;
          if (bVar5 <= uVar14) {
            return;
          }
          cVar4 = std::istream::get();
          if (cVar4 == '\0') {
            header->zeroBased = true;
            cVar13 = '\x01';
          }
          else {
            cVar13 = header->zeroBased;
          }
          bVar5 = cVar4 + cVar13;
          if (bVar5 - 4 < 0xfffffffd) {
            poVar12 = std::operator<<((ostream *)&std::cout,"not supported componentID:");
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::operator<<(poVar12,'\n');
            goto LAB_00102ea2;
          }
          if (header->colorComponent[bVar5 - 1].used == true) {
            pcVar15 = "used color components";
            goto LAB_00102e9d;
          }
          pCVar16 = header->colorComponent + (bVar5 - 1);
          pCVar16->used = true;
          bVar6 = std::istream::get();
          pCVar16->horizontalSamplingFactor = bVar6 >> 4;
          pCVar16->verticalSamplingFactor = bVar6 & 0xf;
          bVar6 = std::istream::get();
          pCVar16->quantizationTableID = bVar6;
          bVar1 = pCVar16->horizontalSamplingFactor;
          if (bVar5 == 1) {
            bVar2 = pCVar16->verticalSamplingFactor;
            if (bVar1 != '\x01') {
              if (bVar1 != '\x02' && 1 < (byte)(bVar2 - 1)) goto LAB_001030f3;
              if ((bVar1 == '\x02') && ((header->mcuWidth & 1) != 0)) {
                header->mcuWidthReal = header->mcuWidthReal + 1;
              }
            }
            header->horizontalSamplingFactor = bVar1;
            header->verticalSamplingFactor = bVar2;
          }
          else if ((bVar1 != '\x01') || (pCVar16->verticalSamplingFactor != '\x01')) {
LAB_001030f3:
            pcVar15 = "only support samplingFacotor that is 1";
            goto LAB_00102e9d;
          }
          if (3 < bVar6) {
            pcVar15 = "not valid quantization talbe id";
            goto LAB_00102e9d;
          }
          bVar5 = header->numComponents;
        } while ((uint)bVar5 * -3 == 8 - (iVar7 * 0x100 + iVar8));
        pcVar15 = "not consistent length";
      }
    }
  }
  else {
    pcVar15 = "Error mutiple SOFs\n";
  }
LAB_00102e9d:
  std::operator<<((ostream *)&std::cout,pcVar15);
LAB_00102ea2:
  header->valid = false;
  return;
}

Assistant:

void readStartOfFrame(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading SOF Marker \n";
	//there can be only one SOF marker per JPEG file
	
	if (header->numComponents != 0) {
		std::cout << "Error mutiple SOFs\n";
		header->valid = false;
		return;
	}

	uint length = (inFile.get() << 8) + inFile.get();
	byte precision = inFile.get();

	//只支持8位的数据
	if (precision != 8) {
		std::cout << "invalid precision :" << precision << std::endl;
		header->valid = false;
		return;
	}

	header->height = (inFile.get() << 8) + inFile.get();
	header->width = (inFile.get() << 8) + inFile.get();

	header->mcuHeight = (header->height + 7) / 8;
	header->mcuWidth = (header->width + 7) / 8;

	header->mcuHeightReal = header->mcuHeight;
	header->mcuWidthReal = header->mcuWidth;

	if (header->height == 0 || header->width == 0) {
		std::cout << "zero width or height\n";
		header->valid = false;
		return;
	}
	
	header->numComponents = inFile.get();
	if (header->numComponents == 4) {
		std::cout << "not support CMYK color mode";
		header->valid = false;
		return;
	}

	if (header->numComponents == 0) {
		std::cout << "number of color components must not be zero";
		header->valid = false;
		return;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		byte componentID = inFile.get();
		/*
			usually 1 2 3, but 0 1 2 is possible ,always force them into 1 2 3
			Y(1), 2(Cb), 3(Cr)
		*/
		if (componentID == 0) {
			header->zeroBased = true;
		}

		if (header->zeroBased) {
			componentID += 1;
		}

		if (componentID == 0 || componentID > 3) {
			std::cout << "not supported componentID:" << (uint)componentID << '\n';
			header->valid = false;
			return;
		}

		ColorComponent* component = &(header->colorComponent[componentID - 1]);
		if (component->used) {
			std::cout << "used color components";
			header->valid = false;
			return;
		}

		component->used = true;
		byte samplingFactor = inFile.get();
		component->horizontalSamplingFactor = samplingFactor >> 4;
		component->verticalSamplingFactor = samplingFactor & 0x0F;
		component->quantizationTableID = inFile.get();

		//lunimance channel
		//只支持1 或者 2
		//horizontal 2的话 代表读取y0 y1, cb cr
		//如果vertical 也2的话, 代表读取 y0 y1 y2 y3 cb cr
		if	(componentID == 1) {

			if (component->horizontalSamplingFactor != 1 && component->verticalSamplingFactor != 2 &&component->verticalSamplingFactor != 1 && component->horizontalSamplingFactor != 2) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}

			if(component->horizontalSamplingFactor == 2 && header->mcuWidth % 2 == 1) {
				header->mcuWidthReal++;
			}

			if(component->verticalSamplingFactor == 2 && header->mcuHeight % 2 == 1) {
				header->verticalSamplingFactor++;
			}

			header->horizontalSamplingFactor = component->horizontalSamplingFactor;
			header->verticalSamplingFactor = component->verticalSamplingFactor;
		} else { 
			//cb cr在一个mcu中永远是一个
			if (component->horizontalSamplingFactor != 1 || component->verticalSamplingFactor != 1) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}
		}


		if (component->quantizationTableID > 3) {
			std::cout << "not valid quantization talbe id";
			header->valid = false;
			return;
		}
		//8是length2byte 加上 1byte sample precision 2bytes的 height 2 bytes的width  1byte的components                
		if (length - 8 - (3 * header->numComponents) != 0) {
			std::cout << "not consistent length";
			header->valid = false;
			return;
		}
	}
}